

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,QGraphicsSceneEvent *event)

{
  char *pcVar1;
  double dVar2;
  ushort uVar3;
  Int IVar4;
  int iVar5;
  undefined8 uVar6;
  QGraphicsSceneMouseEventPrivate *d;
  long lVar7;
  int *piVar8;
  long in_RDX;
  QFlags<Qt::KeyboardModifier> *extraout_RDX;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_00;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_01;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_02;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_03;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_04;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_05;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_06;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_07;
  QFlags<Qt::KeyboardModifier> *pQVar9;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_08;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_09;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_10;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_11;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_12;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_13;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_14;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_15;
  storage_type *psVar10;
  QTextStream *pQVar11;
  QGraphicsSceneContextMenuEvent *ce;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QDebugStateSaver saver;
  QDebugStateSaver saver_1;
  QTextStream *local_88;
  undefined1 local_80 [12];
  QFlagsStorage<Qt::MouseButton> local_74;
  undefined1 *local_70;
  QWidgetData *local_68;
  undefined1 local_60 [16];
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined8 *local_48;
  Latin1Content local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_70,(QDebug *)event);
  pQVar11 = *(QTextStream **)event;
  pQVar11[0x30] = (QTextStream)0x0;
  if (in_RDX == 0) {
    QVar23.m_data = (storage_type *)0x16;
    QVar23.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar23);
    QTextStream::operator<<(pQVar11,(QString *)&local_50);
    auVar12._8_8_ = local_60._8_8_;
    auVar12._0_8_ = local_60._0_8_;
    piVar8 = (int *)CONCAT44(uStack_4c,local_50);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      local_60 = auVar12;
      if (*piVar8 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
      }
    }
  }
  else {
    uVar3 = *(ushort *)(in_RDX + 8);
    switch(uVar3) {
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
      IVar4 = *(Int *)(*(long *)(in_RDX + 0x10) + 0x88);
      local_74.i = *(Int *)(*(long *)(in_RDX + 0x10) + 0x8c);
      QVar13.m_data = (storage_type *)0x19;
      QVar13.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar13);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QMetaObject::indexOfEnumerator((char *)&QEvent::staticMetaObject);
      local_60 = QMetaObject::enumerator(0x831ad0);
      lVar7 = QMetaEnum::valueToKey((ulonglong)local_60);
      pQVar11 = *(QTextStream **)event;
      if (lVar7 == 0) {
        QTextStream::operator<<(pQVar11,(uint)uVar3);
        pQVar11 = *(QTextStream **)event;
        pQVar9 = extraout_RDX_08;
        if (pQVar11[0x30] == (QTextStream)0x1) goto LAB_00626958;
      }
      else {
        psVar10 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar1 = psVar10 + lVar7 + 1;
          psVar10 = psVar10 + 1;
        } while (*pcVar1 != '\0');
        QVar14.m_data = psVar10;
        QVar14.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar14);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar8 = (int *)CONCAT44(uStack_4c,local_50);
        pQVar9 = extraout_RDX;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
            pQVar9 = extraout_RDX_00;
          }
        }
        pQVar11 = *(QTextStream **)event;
        if (pQVar11[0x30] != (QTextStream)0x0) {
LAB_00626958:
          QTextStream::operator<<(pQVar11,' ');
          pQVar9 = extraout_RDX_01;
        }
      }
      if (uVar3 != 0x9b) {
        pQVar11 = *(QTextStream **)event;
        QVar15.m_data = (storage_type *)0x2;
        QVar15.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar15);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar8 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
        auVar12 = QMetaObject::enumerator(0x832328);
        local_60 = auVar12;
        lVar7 = QMetaEnum::valueToKey((ulonglong)local_60);
        pQVar11 = *(QTextStream **)event;
        if (lVar7 == 0) {
          QTextStream::operator<<(pQVar11,IVar4);
          pQVar11 = *(QTextStream **)event;
          pQVar9 = extraout_RDX_15;
          if (pQVar11[0x30] == (QTextStream)0x1) goto LAB_00626a62;
        }
        else {
          psVar10 = (storage_type *)0xffffffffffffffff;
          do {
            pcVar1 = psVar10 + lVar7 + 1;
            psVar10 = psVar10 + 1;
          } while (*pcVar1 != '\0');
          QVar16.m_data = psVar10;
          QVar16.m_size = (qsizetype)&local_50;
          QString::fromUtf8(QVar16);
          QTextStream::operator<<(pQVar11,(QString *)&local_50);
          piVar8 = (int *)CONCAT44(uStack_4c,local_50);
          pQVar9 = extraout_RDX_02;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
              pQVar9 = extraout_RDX_03;
            }
          }
          pQVar11 = *(QTextStream **)event;
          if (pQVar11[0x30] != (QTextStream)0x0) {
LAB_00626a62:
            QTextStream::operator<<(pQVar11,' ');
            pQVar9 = extraout_RDX_04;
          }
        }
      }
      if ((local_74.i != 0) && (IVar4 != local_74.i)) {
        pQVar11 = *(QTextStream **)event;
        QVar17.m_data = &DAT_0000000a;
        QVar17.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar17);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar8 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        QtDebugUtils::formatQFlags<Qt::MouseButton>
                  ((QDebug *)event,(QFlags<Qt::MouseButton> *)&local_74);
        pQVar9 = extraout_RDX_05;
      }
      local_50 = *(undefined4 *)(*(long *)(in_RDX + 0x10) + 0x90);
      QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>
                ((QDebug *)event,(char *)&local_50,pQVar9);
      pQVar11 = *(QTextStream **)event;
      QVar18.m_data = (storage_type *)0x6;
      QVar18.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar18);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      dVar2 = *(double *)(*(long *)(in_RDX + 0x10) + 0x28);
      QTextStream::operator<<(pQVar11,*(double *)(*(long *)(in_RDX + 0x10) + 0x20));
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QTextStream::operator<<(pQVar11,',');
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QTextStream::operator<<(pQVar11,dVar2);
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QVar19.m_data = &DAT_0000000b;
      QVar19.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar19);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      dVar2 = *(double *)(*(long *)(in_RDX + 0x10) + 0x38);
      QTextStream::operator<<(pQVar11,*(double *)(*(long *)(in_RDX + 0x10) + 0x30));
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QTextStream::operator<<(pQVar11,',');
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QTextStream::operator<<(pQVar11,dVar2);
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QVar20.m_data = (storage_type *)0xc;
      QVar20.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar20);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      uVar6 = *(undefined8 *)(*(long *)(in_RDX + 0x10) + 0x40);
      QTextStream::operator<<(pQVar11,(int)uVar6);
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QTextStream::operator<<(pQVar11,',');
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QTextStream::operator<<(pQVar11,(int)((ulong)uVar6 >> 0x20));
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      lVar7 = *(long *)(in_RDX + 0x10);
      iVar5 = *(int *)(lVar7 + 0x94);
      if (iVar5 != 0) {
        QVar21.m_data = (storage_type *)0x2;
        QVar21.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar21);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar8 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
        auVar12 = QMetaObject::enumerator(0x832328);
        local_60 = auVar12;
        lVar7 = QMetaEnum::valueToKey((ulonglong)local_60);
        pQVar11 = *(QTextStream **)event;
        if (lVar7 == 0) {
          QTextStream::operator<<(pQVar11,iVar5);
          pQVar11 = *(QTextStream **)event;
          if (pQVar11[0x30] == (QTextStream)0x1) goto LAB_00626e6e;
        }
        else {
          psVar10 = (storage_type *)0xffffffffffffffff;
          do {
            pcVar1 = psVar10 + lVar7 + 1;
            psVar10 = psVar10 + 1;
          } while (*pcVar1 != '\0');
          QVar22.m_data = psVar10;
          QVar22.m_size = (qsizetype)&local_50;
          QString::fromUtf8(QVar22);
          QTextStream::operator<<(pQVar11,(QString *)&local_50);
          piVar8 = (int *)CONCAT44(uStack_4c,local_50);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
            }
          }
          pQVar11 = *(QTextStream **)event;
          if (pQVar11[0x30] != (QTextStream)0x0) {
LAB_00626e6e:
            QTextStream::operator<<(pQVar11,' ');
            pQVar11 = *(QTextStream **)event;
          }
        }
        lVar7 = *(long *)(in_RDX + 0x10);
      }
      if (*(int *)(lVar7 + 0x98) != 0) {
        QVar34.m_data = (storage_type *)0x8;
        QVar34.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar34);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar8 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
        auVar12 = QMetaObject::enumerator(0x832328);
        local_68 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
        local_60 = auVar12;
        QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_68,(QDebug *)event);
        *(undefined1 *)(*(long *)event + 0x31) = 1;
        QMetaEnum::valueToKeys((ulonglong)&local_50);
        if (local_48 == (undefined8 *)0x0) {
          local_48 = &QByteArray::_empty;
        }
        QDebug::putByteArray((char *)event,(ulong)local_48,local_40);
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        piVar8 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),1,0x10);
          }
        }
        QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_68);
        pQVar11 = *(QTextStream **)event;
      }
      goto LAB_00627a53;
    case 0x9f:
      QVar35.m_data = (storage_type *)0x26;
      QVar35.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar35);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QTextStream::operator<<(pQVar11,*(int *)(*(long *)(in_RDX + 0x10) + 0x4c));
      pQVar9 = extraout_RDX_09;
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
        pQVar9 = extraout_RDX_10;
      }
      local_50 = *(undefined4 *)(*(long *)(in_RDX + 0x10) + 0x48);
      break;
    case 0xa0:
    case 0xa1:
    case 0xa2:
      QVar32.m_data = (storage_type *)0x19;
      QVar32.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar32);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QVar33.m_data = (storage_type *)0x6;
      QVar33.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar33);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      goto LAB_00627818;
    default:
      goto switchD_0062684d_caseD_a3;
    case 0xa4:
    case 0xa5:
    case 0xa6:
    case 0xa7:
      QVar24.m_data = (storage_type *)0x2b;
      QVar24.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar24);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      iVar5 = *(int *)(*(long *)(in_RDX + 0x10) + 0x54);
      QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
      local_60 = QMetaObject::enumerator(0x832328);
      lVar7 = QMetaEnum::valueToKey((ulonglong)local_60);
      pQVar11 = *(QTextStream **)event;
      if (lVar7 == 0) {
        QTextStream::operator<<(pQVar11,iVar5);
        pQVar11 = *(QTextStream **)event;
        if (pQVar11[0x30] == (QTextStream)0x1) goto LAB_00626fd8;
      }
      else {
        psVar10 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar1 = psVar10 + lVar7 + 1;
          psVar10 = psVar10 + 1;
        } while (*pcVar1 != '\0');
        QVar25.m_data = psVar10;
        QVar25.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar25);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar8 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        pQVar11 = *(QTextStream **)event;
        if (pQVar11[0x30] != (QTextStream)0x0) {
LAB_00626fd8:
          QTextStream::operator<<(pQVar11,' ');
          pQVar11 = *(QTextStream **)event;
        }
      }
      QVar26.m_data = (storage_type *)0x12;
      QVar26.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar26);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
      auVar12 = QMetaObject::enumerator(0x832328);
      local_68 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
      local_60 = auVar12;
      QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_68,(QDebug *)event);
      *(undefined1 *)(*(long *)event + 0x31) = 1;
      QMetaEnum::valueToKeys((ulonglong)&local_50);
      if (local_48 == (undefined8 *)0x0) {
        local_48 = &QByteArray::_empty;
      }
      QDebug::putByteArray((char *)event,(ulong)local_48,local_40);
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
      }
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),1,0x10);
        }
      }
      QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_68);
      pQVar11 = *(QTextStream **)event;
      QVar27.m_data = (storage_type *)0x9;
      QVar27.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar27);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      local_88 = *(QTextStream **)event;
      if (local_88[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(local_88,' ');
        local_88 = *(QTextStream **)event;
      }
      *(int *)(local_88 + 0x28) = *(int *)(local_88 + 0x28) + 1;
      operator<<((Stream *)local_80,(QWidget *)&local_88);
      QDebug::~QDebug((QDebug *)local_80);
      QDebug::~QDebug((QDebug *)&local_88);
      lVar7 = *(long *)(in_RDX + 0x10);
      local_60._0_4_ = *(int *)(lVar7 + 0x48);
      pQVar9 = extraout_RDX_06;
      if (*(int *)(lVar7 + 0x48) != 0) {
        pQVar11 = *(QTextStream **)event;
        QVar28.m_data = &DAT_0000000a;
        QVar28.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar28);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar8 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        QtDebugUtils::formatQFlags<Qt::MouseButton>
                  ((QDebug *)event,(QFlags<Qt::MouseButton> *)local_60);
        lVar7 = *(long *)(in_RDX + 0x10);
        pQVar9 = extraout_RDX_07;
      }
      local_50 = *(undefined4 *)(lVar7 + 0x4c);
      QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>
                ((QDebug *)event,(char *)&local_50,pQVar9);
      pQVar11 = *(QTextStream **)event;
      QVar29.m_data = (storage_type *)0x6;
      QVar29.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar29);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      dVar2 = *(double *)(*(long *)(in_RDX + 0x10) + 0x28);
      QTextStream::operator<<(pQVar11,*(double *)(*(long *)(in_RDX + 0x10) + 0x20));
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QTextStream::operator<<(pQVar11,',');
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QTextStream::operator<<(pQVar11,dVar2);
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QVar30.m_data = &DAT_0000000b;
      QVar30.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar30);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      dVar2 = *(double *)(*(long *)(in_RDX + 0x10) + 0x38);
      QTextStream::operator<<(pQVar11,*(double *)(*(long *)(in_RDX + 0x10) + 0x30));
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QTextStream::operator<<(pQVar11,',');
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QTextStream::operator<<(pQVar11,dVar2);
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QVar31.m_data = (storage_type *)0xc;
      QVar31.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar31);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
        }
      }
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      uVar6 = *(undefined8 *)(*(long *)(in_RDX + 0x10) + 0x40);
      QTextStream::operator<<(pQVar11,(int)uVar6);
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QTextStream::operator<<(pQVar11,',');
      pQVar11 = *(QTextStream **)event;
      if (pQVar11[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar11,' ');
        pQVar11 = *(QTextStream **)event;
      }
      QTextStream::operator<<(pQVar11,(int)((ulong)uVar6 >> 0x20));
      goto LAB_00627a5d;
    case 0xa8:
      QVar36.m_data = (storage_type *)0x19;
      QVar36.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar36);
      QTextStream::operator<<(pQVar11,(QString *)&local_50);
      piVar8 = (int *)CONCAT44(uStack_4c,local_50);
      pQVar9 = extraout_RDX_11;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          pQVar9 = extraout_RDX_12;
        }
      }
      if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)event,' ');
        pQVar9 = extraout_RDX_13;
      }
      lVar7 = *(long *)(in_RDX + 0x10);
      local_60._0_4_ = *(int *)(lVar7 + 0x50);
      if (*(int *)(lVar7 + 0x50) != 0) {
        pQVar11 = *(QTextStream **)event;
        QVar37.m_data = &DAT_0000000a;
        QVar37.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar37);
        QTextStream::operator<<(pQVar11,(QString *)&local_50);
        piVar8 = (int *)CONCAT44(uStack_4c,local_50);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
          }
        }
        if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)event,' ');
        }
        QtDebugUtils::formatQFlags<Qt::MouseButton>
                  ((QDebug *)event,(QFlags<Qt::MouseButton> *)local_60);
        lVar7 = *(long *)(in_RDX + 0x10);
        pQVar9 = extraout_RDX_14;
      }
      local_50 = *(undefined4 *)(lVar7 + 0x54);
    }
    QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>
              ((QDebug *)event,(char *)&local_50,pQVar9);
    pQVar11 = *(QTextStream **)event;
    QVar38.m_data = (storage_type *)0x6;
    QVar38.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar38);
    QTextStream::operator<<(pQVar11,(QString *)&local_50);
    piVar8 = (int *)CONCAT44(uStack_4c,local_50);
LAB_00627818:
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
      }
    }
    pQVar11 = *(QTextStream **)event;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = *(QTextStream **)event;
    }
    dVar2 = *(double *)(*(long *)(in_RDX + 0x10) + 0x28);
    QTextStream::operator<<(pQVar11,*(double *)(*(long *)(in_RDX + 0x10) + 0x20));
    pQVar11 = *(QTextStream **)event;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = *(QTextStream **)event;
    }
    QTextStream::operator<<(pQVar11,',');
    pQVar11 = *(QTextStream **)event;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = *(QTextStream **)event;
    }
    QTextStream::operator<<(pQVar11,dVar2);
    pQVar11 = *(QTextStream **)event;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = *(QTextStream **)event;
    }
    QVar39.m_data = &DAT_0000000b;
    QVar39.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar39);
    QTextStream::operator<<(pQVar11,(QString *)&local_50);
    piVar8 = (int *)CONCAT44(uStack_4c,local_50);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
      }
    }
    pQVar11 = *(QTextStream **)event;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = *(QTextStream **)event;
    }
    dVar2 = *(double *)(*(long *)(in_RDX + 0x10) + 0x38);
    QTextStream::operator<<(pQVar11,*(double *)(*(long *)(in_RDX + 0x10) + 0x30));
    pQVar11 = *(QTextStream **)event;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = *(QTextStream **)event;
    }
    QTextStream::operator<<(pQVar11,',');
    pQVar11 = *(QTextStream **)event;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = *(QTextStream **)event;
    }
    QTextStream::operator<<(pQVar11,dVar2);
    pQVar11 = *(QTextStream **)event;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = *(QTextStream **)event;
    }
    QVar40.m_data = (storage_type *)0xc;
    QVar40.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar40);
    QTextStream::operator<<(pQVar11,(QString *)&local_50);
    piVar8 = (int *)CONCAT44(uStack_4c,local_50);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_4c,local_50),2,0x10);
      }
    }
    pQVar11 = *(QTextStream **)event;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = *(QTextStream **)event;
    }
    uVar6 = *(undefined8 *)(*(long *)(in_RDX + 0x10) + 0x40);
    QTextStream::operator<<(pQVar11,(int)uVar6);
    pQVar11 = *(QTextStream **)event;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = *(QTextStream **)event;
    }
    QTextStream::operator<<(pQVar11,',');
    pQVar11 = *(QTextStream **)event;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = *(QTextStream **)event;
    }
    QTextStream::operator<<(pQVar11,(int)((ulong)uVar6 >> 0x20));
    pQVar11 = *(QTextStream **)event;
    if (pQVar11[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar11,' ');
      pQVar11 = *(QTextStream **)event;
    }
LAB_00627a53:
    QTextStream::operator<<(pQVar11,')');
  }
LAB_00627a5d:
  if ((*(QTextStream **)event)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)event,' ');
  }
switchD_0062684d_caseD_a3:
  uVar6 = *(undefined8 *)event;
  *(undefined8 *)event = 0;
  *(undefined8 *)debug.stream = uVar6;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QGraphicsSceneEvent *event)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    if (!event) {
        debug << "QGraphicsSceneEvent(0)";
        return debug;
    }

    const QEvent::Type type = event->type();
    switch (type) {
    case QEvent::GraphicsSceneMouseMove:
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseDoubleClick: {
        const QGraphicsSceneMouseEvent *me = static_cast<const QGraphicsSceneMouseEvent *>(event);
        const Qt::MouseButton button = me->button();
        const Qt::MouseButtons buttons = me->buttons();
        debug << "QGraphicsSceneMouseEvent(";
        QtDebugUtils::formatQEnum(debug, type);
        if (type != QEvent::GraphicsSceneMouseMove) {
            debug << ", ";
            QtDebugUtils::formatQEnum(debug, button);
        }
        if (buttons && button != buttons) {
            debug << ", buttons=";
            QtDebugUtils::formatQFlags(debug, buttons);
        }
        QtDebugUtils::formatNonNullQFlags(debug, ", ", me->modifiers());
        formatPositions(debug, me);
        QtDebugUtils::formatNonNullQEnum(debug, ", ", me->source());
        QtDebugUtils::formatNonNullQFlags(debug, ", flags=", me->flags());
        debug << ')';
    }
        break;
    case QEvent::GraphicsSceneContextMenu: {
        const QGraphicsSceneContextMenuEvent *ce = static_cast<const QGraphicsSceneContextMenuEvent *>(event);
        debug << "QGraphicsSceneContextMenuEvent(reason=" << ce->reason();
        QtDebugUtils::formatNonNullQFlags(debug, ", ", ce->modifiers());
        formatPositions(debug, ce);
        debug << ')';
    }
        break;
    case QEvent::GraphicsSceneHoverEnter:
    case QEvent::GraphicsSceneHoverMove:
    case QEvent::GraphicsSceneHoverLeave:
        debug << "QGraphicsSceneHoverEvent(";
        formatPositions(debug, static_cast<const QGraphicsSceneHoverEvent *>(event));
        debug << ')';
        break;
    case QEvent::GraphicsSceneHelp:
        break;
    case QEvent::GraphicsSceneDragEnter:
    case QEvent::GraphicsSceneDragMove:
    case QEvent::GraphicsSceneDragLeave:
    case QEvent::GraphicsSceneDrop: {
        const QGraphicsSceneDragDropEvent *de = static_cast<const QGraphicsSceneDragDropEvent *>(event);
        debug << "QGraphicsSceneDragDropEvent(proposedAction=";
        QtDebugUtils::formatQEnum(debug, de->proposedAction());
        debug << ", possibleActions=";
        QtDebugUtils::formatQFlags(debug, de->possibleActions());
        debug << ", source=" << de->source();
        QtDebugUtils::formatNonNullQFlags(debug, ", buttons=", de->buttons());
        QtDebugUtils::formatNonNullQFlags(debug, ", ", de->modifiers());
        formatPositions(debug, de);
    }
        break;
    case QEvent::GraphicsSceneWheel: {
        const QGraphicsSceneWheelEvent *we = static_cast<const QGraphicsSceneWheelEvent *>(event);
        debug << "QGraphicsSceneWheelEvent(";
        QtDebugUtils::formatNonNullQFlags(debug, ", buttons=", we->buttons());
        QtDebugUtils::formatNonNullQFlags(debug, ", ", we->modifiers());
        formatPositions(debug, we);
        debug << ')';
    }
        break;
    default:
        break;
    }
    return debug;
}